

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O1

void __thiscall
HDWallet_ConvertTest_Test::~HDWallet_ConvertTest_Test(HDWallet_ConvertTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HDWallet, ConvertTest) {
  ByteData actual_entropy;
  std::vector<std::string> actual_mnemonic;
  ByteData actual_seed;
  bool actual_is_valid;
  HDWallet hd_wallet;

  HDWallet copy_wallet;
  ByteData copy_seed;
  for (Bip39TestVector test_vector : bip39_test_vectors) {
    EXPECT_NO_THROW(hd_wallet = HDWallet(test_vector.mnemonic, test_passphrase));
    EXPECT_NO_THROW(actual_seed = hd_wallet.GetSeed());
    EXPECT_NO_THROW(actual_entropy = HDWallet::ConvertMnemonicToEntropy(test_vector.mnemonic, language));
    EXPECT_NO_THROW(actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(test_vector.entropy, language));
    EXPECT_NO_THROW(actual_is_valid = HDWallet::CheckValidMnemonic(test_vector.mnemonic, language));
    EXPECT_TRUE(actual_entropy.Equals(test_vector.entropy));
    EXPECT_EQ(actual_mnemonic, test_vector.mnemonic);
    EXPECT_TRUE(actual_seed.Equals(test_vector.seed));
    EXPECT_TRUE(actual_is_valid);

    copy_wallet = HDWallet(actual_seed);
    EXPECT_NO_THROW(copy_seed = copy_wallet.GetSeed());
    EXPECT_TRUE(copy_seed.Equals(test_vector.seed));
  }
}